

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O0

err_t beltCHEWrap(void *dest,octet *mac,void *src1,size_t count1,void *src2,size_t count2,octet *key
                 ,size_t len,octet *iv)

{
  bool_t bVar1;
  octet *mac_00;
  octet *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *in_R8;
  octet *in_R9;
  void *state;
  void *in_stack_ffffffffffffffb8;
  
  if ((((((count2 == 0x10) || (count2 == 0x18)) || (count2 == 0x20)) &&
       ((bVar1 = memIsValid(in_RDX,(size_t)in_RCX), bVar1 != 0 &&
        (bVar1 = memIsValid(in_R8,(size_t)in_R9), bVar1 != 0)))) &&
      ((bVar1 = memIsValid(state,count2), bVar1 != 0 &&
       ((bVar1 = memIsValid(src2,0x10), bVar1 != 0 &&
        (bVar1 = memIsValid(in_RDI,(size_t)in_RCX), bVar1 != 0)))))) &&
     (bVar1 = memIsValid(in_RSI,8), bVar1 != 0)) {
    beltCHE_keep();
    mac_00 = (octet *)blobCreate((size_t)in_stack_ffffffffffffffb8);
    if (mac_00 == (octet *)0x0) {
      return 0x6e;
    }
    beltCHEStart(in_RDX,in_RCX,(size_t)in_R8,in_R9);
    beltCHEStepI(in_R8,(size_t)in_R9,mac_00);
    memMove(mac_00,in_stack_ffffffffffffffb8,0x148216);
    beltCHEStepE(in_R8,(size_t)in_R9,mac_00);
    beltCHEStepA(in_R8,(size_t)in_R9,mac_00);
    beltCHEStepG(mac_00,in_stack_ffffffffffffffb8);
    blobClose((blob_t)0x148257);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltCHEWrap(void* dest, octet mac[8], const void* src1, size_t count1,
	const void* src2, size_t count2, const octet key[], size_t len,
	const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (len != 16 && len != 24 && len != 32 ||
		!memIsValid(src1, count1) ||
		!memIsValid(src2, count2) ||
		!memIsValid(key, len) ||
		!memIsValid(iv, 16) ||
		!memIsValid(dest, count1) ||
		!memIsValid(mac, 8))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltCHE_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// установить защиту (I перед E из-за разрешенного пересечения src2 и dest)
	beltCHEStart(state, key, len, iv);
	beltCHEStepI(src2, count2, state);
	memMove(dest, src1, count1);
	beltCHEStepE(dest, count1, state);
	beltCHEStepA(dest, count1, state);
	beltCHEStepG(mac, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}